

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

bool QtPrivate::QEqualityOperatorForType<QDBusPendingReply<QDBusVariant>,_true>::equals
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  bool bVar1;
  long in_FS_OFFSET;
  QVariant local_60;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusPendingReply<QDBusVariant>::argumentAt<0>
            ((Type *)&local_40,(QDBusPendingReply<QDBusVariant> *)a);
  QDBusPendingReply<QDBusVariant>::argumentAt<0>
            ((Type *)&local_60,(QDBusPendingReply<QDBusVariant> *)b);
  bVar1 = operator==((QDBusVariant *)&local_40,(QDBusVariant *)&local_60);
  QVariant::~QVariant(&local_60);
  QVariant::~QVariant(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool equals(const QMetaTypeInterface *, const void *a, const void *b)
    { return *reinterpret_cast<const T *>(a) == *reinterpret_cast<const T *>(b); }